

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int http_server_init(http_server_t *server,uint num_clients,uint max_clients,
                    http_client_callback_t *callback,int fd)

{
  char *pcVar1;
  http_client_t *phVar2;
  long lVar3;
  int iVar4;
  
  if (server == (http_server_t *)0x0) {
    __assert_fail("server != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",0x31,
                  "int http_server_init(http_server_t *, unsigned int, unsigned int, http_client_callback_t *, int)"
                 );
  }
  if (num_clients != 0) {
    if (fd != -1) {
      iVar4 = 0;
      server->num_clients = 0;
      server->max_clients = 0;
      server->callback = (http_client_callback_t *)0x0;
      server->fd = -1;
      phVar2 = (http_client_t *)malloc((ulong)num_clients * 0x2018);
      server->clients = phVar2;
      if (phVar2 != (http_client_t *)0x0) {
        server->num_clients = num_clients;
        server->max_clients = max_clients;
        server->callback = callback;
        lVar3 = 0;
        do {
          pcVar1 = phVar2->buf + lVar3 + -0x10;
          pcVar1[0] = -1;
          pcVar1[1] = -1;
          pcVar1[2] = -1;
          pcVar1[3] = -1;
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
          pcVar1[8] = '\0';
          pcVar1[9] = '\0';
          pcVar1[10] = '\0';
          pcVar1[0xb] = '\0';
          pcVar1[0xc] = '\0';
          pcVar1[0xd] = '\0';
          pcVar1[0xe] = '\0';
          pcVar1[0xf] = '\0';
          lVar3 = lVar3 + 0x2018;
        } while ((ulong)num_clients * 0x2018 - lVar3 != 0);
        server->count_clients = 0;
        server->fd = fd;
        iVar4 = 1;
      }
      return iVar4;
    }
    __assert_fail("fd != -1","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",
                  0x33,
                  "int http_server_init(http_server_t *, unsigned int, unsigned int, http_client_callback_t *, int)"
                 );
  }
  __assert_fail("num_clients > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",0x32,
                "int http_server_init(http_server_t *, unsigned int, unsigned int, http_client_callback_t *, int)"
               );
}

Assistant:

int http_server_init(http_server_t *server,
                     unsigned int num_clients,
                     unsigned int max_clients,
                     http_client_callback_t *callback,
                     int fd) {
  assert(server != NULL);
  assert(num_clients > 0);
  assert(fd != -1);

  http_server_reset(server);
  server->clients = malloc(sizeof(http_client_t) * num_clients);
  if (server->clients == NULL)
    return 0;
  server->num_clients = num_clients;
  server->max_clients = max_clients;
  server->callback = callback;
  
  unsigned int i;
  for (i = 0; i < server->num_clients; i++) {
    http_client_init(server->clients + i);
  }
  server->count_clients = 0;
  server->fd = fd;

  return 1;
}